

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_helper.c
# Opt level: O0

int input_open_fd(char *filename)

{
  int iVar1;
  int ret;
  char *filename_local;
  
  iVar1 = open(filename,0);
  return iVar1;
}

Assistant:

int
input_open_fd(char const *filename)
{
#ifdef G_OS_WIN32
	gunichar2 *utf16 = g_utf8_to_utf16(filename, -1, NULL, NULL, NULL);
	int ret = _wopen(utf16, _O_RDONLY | _O_BINARY);
	g_free(utf16);
#else
	int ret = open(filename, O_RDONLY);
#endif
	return ret;
}